

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * WebPSafeMalloc(uint64_t nmemb,size_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  
  if ((nmemb != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = nmemb,
     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x400000000)) / auVar1,0) < size)) {
    return (void *)0x0;
  }
  pvVar2 = malloc(size * nmemb);
  return pvVar2;
}

Assistant:

static int CheckSizeArgumentsOverflow(uint64_t nmemb, size_t size) {
  const uint64_t total_size = nmemb * size;
  if (nmemb == 0) return 1;
  if ((uint64_t)size > WEBP_MAX_ALLOCABLE_MEMORY / nmemb) return 0;
  if (!CheckSizeOverflow(total_size)) return 0;
#if defined(PRINT_MEM_INFO) && defined(MALLOC_FAIL_AT)
  if (countdown_to_fail > 0 && --countdown_to_fail == 0) {
    return 0;    // fake fail!
  }
#endif
#if defined(PRINT_MEM_INFO) && defined(MALLOC_LIMIT)
  if (mem_limit > 0) {
    const uint64_t new_total_mem = (uint64_t)total_mem + total_size;
    if (!CheckSizeOverflow(new_total_mem) ||
        new_total_mem > mem_limit) {
      return 0;   // fake fail!
    }
  }
#endif

  return 1;
}